

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_red.c
# Opt level: O2

void zzRedBarrStart(word *barr_param,word *mod,size_t n,void *stack)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)((long)stack + n * 0x10);
  wwSetZero((word *)stack,n * 2);
  *puVar1 = 1;
  zzDiv(barr_param,(word *)stack,(word *)stack,n * 2 + 1,mod,n,puVar1 + 1);
  return;
}

Assistant:

void zzRedBarrStart(word barr_param[], const word mod[], size_t n, 
	void* stack)
{
	word* divident = (word*)stack;
	stack = divident + 2 * n + 1;
	// pre
	ASSERT(wwIsDisjoint2(barr_param, n + 2, mod, n));
	ASSERT(n > 0 && mod[n - 1] != 0);
	// divident <- B^{2n}
	wwSetZero(divident, 2 * n);
	divident[2 * n] = 1;
	// barr_param <- divident \div mod
	zzDiv(barr_param, divident, divident, 2 * n + 1, mod, n, stack);
}